

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_list_config_type.cc
# Opt level: O2

int __thiscall
aliyun::Emr::ListConfigType
          (Emr *this,EmrListConfigTypeResponseType *response,EmrErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *pVVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_00;
  char *pcVar7;
  uint uVar8;
  Value val;
  allocator<char> local_3c4;
  allocator<char> local_3c3;
  allocator<char> local_3c2;
  allocator<char> local_3c1;
  EmrListConfigTypeResponseType *local_3c0;
  ValueHolder local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  ValueHolder VStack_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_398;
  undefined8 uStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  undefined8 local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined1 local_318;
  undefined1 local_317;
  undefined1 local_316;
  undefined1 local_315;
  vector<aliyun::EmrListConfigTypeInstanceTypeType,_std::allocator<aliyun::EmrListConfigTypeInstanceTypeType>_>
  *local_310;
  undefined1 local_308 [24];
  string local_2f0 [8];
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  Value *local_2d0;
  vector<aliyun::EmrListConfigTypeEmrVerTypeType,_std::allocator<aliyun::EmrListConfigTypeEmrVerTypeType>_>
  *local_2c8;
  string str_response;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  local_3c0 = response;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)&local_3b8.bool_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&local_160);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar7,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)&local_3b8.bool_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"ListConfigType",(allocator<char> *)local_308);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"RegionId",(allocator<char> *)&local_3b8.bool_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,this->region_id_,(allocator<char> *)local_308);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)&local_3b8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8.bool_,anon_var_dwarf_13598b + 9,&local_3c1);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_3b8.bool_);
        std::__cxx11::string::~string((string *)&local_3b8.bool_);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)&local_3b8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8.bool_,anon_var_dwarf_13598b + 9,&local_3c2);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_3b8.bool_);
        std::__cxx11::string::~string((string *)&local_3b8.bool_);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)&local_3b8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8.bool_,anon_var_dwarf_13598b + 9,&local_3c3);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_3b8.bool_);
        std::__cxx11::string::~string((string *)&local_3b8.bool_);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)&local_3b8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8.bool_,anon_var_dwarf_13598b + 9,&local_3c4);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_3b8.bool_);
        std::__cxx11::string::~string((string *)&local_3b8.bool_);
      }
      if (local_3c0 != (EmrListConfigTypeResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"securityGroupTypes");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"securityGroupTypes");
          bVar1 = Json::Value::isMember(pVVar4,"SecurityGroupType");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"securityGroupTypes");
            pVVar4 = Json::Value::operator[](pVVar4,"SecurityGroupType");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar4), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                local_3b8.string_ = (char *)&local_3a8;
                uStack_3b0 = 0;
                local_3a8 = local_3a8 & 0xffffffffffffff00;
                local_398 = &local_388;
                uStack_390 = 0;
                local_388._M_allocated_capacity =
                     local_388._M_allocated_capacity & 0xffffffffffffff00;
                local_378._M_allocated_capacity = (size_type)&local_368;
                local_378._8_8_ = 0;
                local_368._M_allocated_capacity =
                     local_368._M_allocated_capacity & 0xffffffffffffff00;
                pVVar5 = Json::Value::operator[](pVVar4,uVar8);
                bVar1 = Json::Value::isMember(pVVar5,"Name");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Name");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3b8.bool_,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"State");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"State");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_398,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Id");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"Id");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar5);
                  std::__cxx11::string::operator=
                            ((string *)local_378._M_local_buf,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                std::
                vector<aliyun::EmrListConfigTypeSecurityGroupTypeType,_std::allocator<aliyun::EmrListConfigTypeSecurityGroupTypeType>_>
                ::push_back(&local_3c0->security_group_types,(value_type *)&local_3b8);
                EmrListConfigTypeSecurityGroupTypeType::~EmrListConfigTypeSecurityGroupTypeType
                          ((EmrListConfigTypeSecurityGroupTypeType *)&local_3b8);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"instanceTypes");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"instanceTypes");
          bVar1 = Json::Value::isMember(pVVar4,"InstanceType");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"instanceTypes");
            pVVar4 = Json::Value::operator[](pVVar4,"InstanceType");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_310 = &local_3c0->instance_types;
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar4), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                local_3b8.string_ = (char *)&local_3a8;
                uStack_3b0 = 0;
                local_3a8 = local_3a8 & 0xffffffffffffff00;
                local_398 = &local_388;
                uStack_390 = 0;
                local_388._M_allocated_capacity =
                     local_388._M_allocated_capacity & 0xffffffffffffff00;
                local_378._M_allocated_capacity = (size_type)&local_368;
                local_378._8_8_ = 0;
                local_368._M_allocated_capacity =
                     local_368._M_allocated_capacity & 0xffffffffffffff00;
                local_358._M_allocated_capacity = (size_type)&local_348;
                local_358._8_8_ = 0;
                local_348._M_local_buf[0] = '\0';
                local_338 = &local_328;
                local_330 = 0;
                local_328._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,uVar8);
                bVar1 = Json::Value::isMember(pVVar5,"Classify");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Classify");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3b8.bool_,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"State");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"State");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_398,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Type");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Type");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=
                            ((string *)local_378._M_local_buf,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"CpuCore");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"CpuCore");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=
                            ((string *)local_358._M_local_buf,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"MemSize");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"MemSize");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_338,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"HasCloudDisk");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"HasCloudDisk");
                  local_318 = Json::Value::asBool(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"HasLocalDisk");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"HasLocalDisk");
                  local_317 = Json::Value::asBool(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"HasLocalSSD");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"HasLocalSSD");
                  local_316 = Json::Value::asBool(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"HasCloudSSD");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"HasCloudSSD");
                  local_315 = Json::Value::asBool(pVVar5);
                }
                std::
                vector<aliyun::EmrListConfigTypeInstanceTypeType,_std::allocator<aliyun::EmrListConfigTypeInstanceTypeType>_>
                ::push_back(local_310,(value_type *)&local_3b8);
                EmrListConfigTypeInstanceTypeType::~EmrListConfigTypeInstanceTypeType
                          ((EmrListConfigTypeInstanceTypeType *)&local_3b8);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"EmrVerTypes");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"EmrVerTypes");
          bVar1 = Json::Value::isMember(pVVar4,"EmrVerType");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"EmrVerTypes");
            pVVar4 = Json::Value::operator[](pVVar4,"EmrVerType");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_2c8 = &local_3c0->emr_ver_types;
              uVar8 = 0;
              local_2d0 = pVVar4;
              while (pVVar4 = local_2d0, AVar3 = Json::Value::size(local_2d0), uVar8 < AVar3) {
                local_308._0_8_ = (pointer)0x0;
                local_308._8_8_ = (pointer)0x0;
                local_308._16_8_ = 0;
                local_2f0 = (string  [8])&local_2e0;
                local_2e8 = 0;
                local_2e0._M_local_buf[0] = '\0';
                pVVar4 = Json::Value::operator[](pVVar4,uVar8);
                bVar1 = Json::Value::isMember(pVVar4,"Name");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"Name");
                  Json::Value::asString_abi_cxx11_((string *)&local_3b8,pVVar5);
                  std::__cxx11::string::operator=(local_2f0,(string *)&local_3b8.bool_);
                  std::__cxx11::string::~string((string *)&local_3b8.bool_);
                }
                bVar1 = Json::Value::isMember(pVVar4,"SubModules");
                local_310 = (vector<aliyun::EmrListConfigTypeInstanceTypeType,_std::allocator<aliyun::EmrListConfigTypeInstanceTypeType>_>
                             *)CONCAT44(local_310._4_4_,uVar8);
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"SubModules");
                  bVar1 = Json::Value::isMember(pVVar5,"SubModule");
                  if (bVar1) {
                    pVVar4 = Json::Value::operator[](pVVar4,"SubModules");
                    pVVar4 = Json::Value::operator[](pVVar4,"SubModule");
                    bVar1 = Json::Value::isArray(pVVar4);
                    if (bVar1) {
                      for (uVar8 = 0; AVar3 = Json::Value::size(pVVar4), uVar8 < AVar3;
                          uVar8 = uVar8 + 1) {
                        local_3b8.string_ = (char *)&local_3a8;
                        uStack_3b0 = 0;
                        local_3a8 = local_3a8 & 0xffffffffffffff00;
                        local_398 = &local_388;
                        uStack_390 = 0;
                        local_388._M_allocated_capacity =
                             local_388._M_allocated_capacity & 0xffffffffffffff00;
                        local_378._M_allocated_capacity = (size_type)&local_368;
                        local_378._8_8_ = 0;
                        local_368._M_allocated_capacity =
                             local_368._M_allocated_capacity & 0xffffffffffffff00;
                        pVVar5 = Json::Value::operator[](pVVar4,uVar8);
                        bVar1 = Json::Value::isMember(pVVar5,"Name");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"Name");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=
                                    ((string *)&local_3b8.bool_,(string *)&local_160);
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"Required");
                        if (bVar1) {
                          pVVar6 = Json::Value::operator[](pVVar5,"Required");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                          std::__cxx11::string::operator=((string *)&local_398,(string *)&local_160)
                          ;
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"Optional");
                        if (bVar1) {
                          pVVar5 = Json::Value::operator[](pVVar5,"Optional");
                          Json::Value::asString_abi_cxx11_(&local_160,pVVar5);
                          std::__cxx11::string::operator=
                                    ((string *)local_378._M_local_buf,(string *)&local_160);
                          std::__cxx11::string::~string((string *)&local_160);
                        }
                        std::
                        vector<aliyun::EmrListConfigTypeSubModuleType,_std::allocator<aliyun::EmrListConfigTypeSubModuleType>_>
                        ::push_back((vector<aliyun::EmrListConfigTypeSubModuleType,_std::allocator<aliyun::EmrListConfigTypeSubModuleType>_>
                                     *)local_308,(value_type *)&local_3b8);
                        EmrListConfigTypeSubModuleType::~EmrListConfigTypeSubModuleType
                                  ((EmrListConfigTypeSubModuleType *)&local_3b8);
                      }
                    }
                  }
                }
                std::
                vector<aliyun::EmrListConfigTypeEmrVerTypeType,_std::allocator<aliyun::EmrListConfigTypeEmrVerTypeType>_>
                ::push_back(local_2c8,(value_type *)local_308);
                iVar2 = (int)local_310;
                EmrListConfigTypeEmrVerTypeType::~EmrListConfigTypeEmrVerTypeType
                          ((EmrListConfigTypeEmrVerTypeType *)local_308);
                uVar8 = iVar2 + 1;
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"ZoneTypes");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"ZoneTypes");
          bVar1 = Json::Value::isMember(pVVar4,"ZoneType");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"ZoneTypes");
            pVVar4 = Json::Value::operator[](pVVar4,"ZoneType");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_3c0 = (EmrListConfigTypeResponseType *)&local_3c0->zone_types;
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar4), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                uStack_390 = 0;
                local_3a8 = 0;
                VStack_3a0.int_ = 0;
                local_3b8.int_ = 0;
                uStack_3b0 = 0;
                local_388._M_allocated_capacity = (size_type)&local_378;
                local_388._8_8_ = 0;
                local_378._M_allocated_capacity =
                     local_378._M_allocated_capacity & 0xffffffffffffff00;
                local_368._M_allocated_capacity = (size_type)&local_358;
                local_368._8_8_ = 0;
                local_358._M_allocated_capacity =
                     local_358._M_allocated_capacity & 0xffffffffffffff00;
                pVVar5 = Json::Value::operator[](pVVar4,uVar8);
                bVar1 = Json::Value::isMember(pVVar5,"Name");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Name");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=
                            ((string *)local_388._M_local_buf,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Id");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Id");
                  Json::Value::asString_abi_cxx11_((string *)local_308,pVVar6);
                  std::__cxx11::string::operator=
                            ((string *)local_368._M_local_buf,(string *)local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                bVar1 = Json::Value::isMember(pVVar5,"AvailableResourceCreateionList");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"AvailableResourceCreateionList");
                  bVar1 = Json::Value::isMember(pVVar6,"AvailableResourceCreateion");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"AvailableResourceCreateionList");
                    pVVar6 = Json::Value::operator[](pVVar6,"AvailableResourceCreateion");
                    anon_unknown.dwarf_58f95::
                    Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pVVar6,(Value *)&local_3b8,vec);
                  }
                }
                bVar1 = Json::Value::isMember(pVVar5,"AvailableDiskCategoriesList");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"AvailableDiskCategoriesList");
                  bVar1 = Json::Value::isMember(pVVar6,"AvailableDiskCategories");
                  if (bVar1) {
                    pVVar5 = Json::Value::operator[](pVVar5,"AvailableDiskCategoriesList");
                    pVVar5 = Json::Value::operator[](pVVar5,"AvailableDiskCategories");
                    anon_unknown.dwarf_58f95::
                    Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pVVar5,(Value *)&VStack_3a0,vec_00);
                  }
                }
                std::
                vector<aliyun::EmrListConfigTypeZoneTypeType,_std::allocator<aliyun::EmrListConfigTypeZoneTypeType>_>
                ::push_back((vector<aliyun::EmrListConfigTypeZoneTypeType,_std::allocator<aliyun::EmrListConfigTypeZoneTypeType>_>
                             *)local_3c0,(value_type *)&local_3b8);
                EmrListConfigTypeZoneTypeType::~EmrListConfigTypeZoneTypeType
                          ((EmrListConfigTypeZoneTypeType *)&local_3b8);
              }
            }
          }
        }
      }
      goto LAB_0013e6d8;
    }
  }
  iVar2 = -1;
  if (error_info != (EmrErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0013e6d8:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Emr::ListConfigType(EmrListConfigTypeResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListConfigType");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}